

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascbin-cursor.c
# Opt level: O0

int coda_ascbin_cursor_goto_next_record_field(coda_cursor_conflict *cursor)

{
  int iVar1;
  coda_dynamic_type *pcVar2;
  coda_type *local_670;
  undefined1 local_668 [8];
  coda_cursor_conflict record_cursor_1;
  int64_t rel_bit_offset;
  long available_index;
  coda_cursor_conflict record_cursor;
  long index;
  long lStack_28;
  int available;
  int64_t bit_offset;
  coda_type_record *record;
  coda_cursor_conflict *cursor_local;
  
  index._4_4_ = 1;
  if ((cursor->stack[cursor->n + -2].type)->backend < coda_backend_memory) {
    local_670 = (coda_type *)cursor->stack[cursor->n + -2].type;
  }
  else {
    local_670 = (cursor->stack[cursor->n + -2].type)->definition;
  }
  bit_offset = (int64_t)local_670;
  record_cursor.stack[0x1f].bit_offset = cursor->stack[cursor->n + -1].index + 1;
  record = (coda_type_record *)cursor;
  if ((record_cursor.stack[0x1f].bit_offset < 0) ||
     ((long)local_670[1].name <= record_cursor.stack[0x1f].bit_offset)) {
    coda_set_error(-0x65,"field index (%ld) is not in the range [0,%ld)",
                   record_cursor.stack[0x1f].bit_offset,local_670[1].name);
    cursor_local._4_4_ = -1;
  }
  else {
    lStack_28 = cursor->stack[cursor->n + -2].bit_offset;
    if (local_670[1].attributes == (coda_type_record *)0x0) {
      iVar1 = get_next_relative_field_bit_offset
                        (cursor,&record_cursor_1.stack[0x1f].bit_offset,(int64_t *)0x0);
      if (iVar1 != 0) {
        return -1;
      }
      lStack_28 = record_cursor_1.stack[0x1f].bit_offset + lStack_28;
      if (*(long *)(*(long *)(*(long *)(bit_offset + 0x50) +
                             record_cursor.stack[0x1f].bit_offset * 8) + 0x20) != 0) {
        memcpy(local_668,record,0x310);
        record_cursor_1.product._0_4_ = (int)record_cursor_1.product + -1;
        iVar1 = coda_expression_eval_bool
                          (*(coda_expression **)
                            (*(long *)(*(long *)(bit_offset + 0x50) +
                                      record_cursor.stack[0x1f].bit_offset * 8) + 0x20),
                           (coda_cursor_conflict *)local_668,(int *)((long)&index + 4));
        if (iVar1 != 0) {
          coda_add_error_message(" for available expression");
          coda_cursor_add_to_error_message((coda_cursor_conflict *)record);
          return -1;
        }
      }
    }
    else {
      memcpy(&available_index,cursor,0x310);
      record_cursor.product._0_4_ = (int)record_cursor.product + -1;
      iVar1 = coda_cursor_get_available_union_field_index
                        ((coda_cursor_conflict *)&available_index,&rel_bit_offset);
      if (iVar1 != 0) {
        return -1;
      }
      if (record_cursor.stack[0x1f].bit_offset != rel_bit_offset) {
        index._4_4_ = 0;
      }
    }
    if (index._4_4_ == 0) {
      pcVar2 = coda_no_data_singleton(*(coda_format *)bit_offset);
      (&record->name)[(long)(int)(record->type_class - coda_array_class) * 3] = (char *)pcVar2;
    }
    else {
      (&record->name)[(long)(int)(record->type_class - coda_array_class) * 3] =
           *(char **)(*(long *)(*(long *)(bit_offset + 0x50) +
                               record_cursor.stack[0x1f].bit_offset * 8) + 0x10);
    }
    (&record->description)[(long)(int)(record->type_class - coda_array_class) * 3] =
         (char *)record_cursor.stack[0x1f].bit_offset;
    (&record->bit_size)[(long)(int)(record->type_class - coda_array_class) * 3] = lStack_28;
    cursor_local._4_4_ = 0;
  }
  return cursor_local._4_4_;
}

Assistant:

int coda_ascbin_cursor_goto_next_record_field(coda_cursor *cursor)
{
    coda_type_record *record;
    int64_t bit_offset;
    int available = 1;
    long index;

    record = (coda_type_record *)coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 2].type);
    index = cursor->stack[cursor->n - 1].index + 1;
    if (index < 0 || index >= record->num_fields)
    {
        coda_set_error(CODA_ERROR_INVALID_INDEX, "field index (%ld) is not in the range [0,%ld)", index,
                       record->num_fields);
        return -1;
    }

    bit_offset = cursor->stack[cursor->n - 2].bit_offset;
    if (record->union_field_expr != NULL)
    {
        coda_cursor record_cursor = *cursor;
        long available_index;

        record_cursor.n--;
        if (coda_cursor_get_available_union_field_index(&record_cursor, &available_index) != 0)
        {
            return -1;
        }
        if (index != available_index)
        {
            available = 0;
        }
    }
    else
    {
        int64_t rel_bit_offset;

        if (get_next_relative_field_bit_offset(cursor, &rel_bit_offset, NULL) != 0)
        {
            return -1;
        }
        bit_offset += rel_bit_offset;
        if (record->field[index]->available_expr != NULL)
        {
            coda_cursor record_cursor = *cursor;

            record_cursor.n--;
            if (coda_expression_eval_bool(record->field[index]->available_expr, &record_cursor, &available) != 0)
            {
                coda_add_error_message(" for available expression");
                coda_cursor_add_to_error_message(cursor);
                return -1;
            }
        }
    }
    if (available)
    {
        cursor->stack[cursor->n - 1].type = (coda_dynamic_type *)record->field[index]->type;
    }
    else
    {
        cursor->stack[cursor->n - 1].type = coda_no_data_singleton(record->format);
    }
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = bit_offset;

    return 0;
}